

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

bool __thiscall ON_NurbsCage::IsPeriodic(ON_NurbsCage *this,int dir)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  double *pointA;
  ulong uVar11;
  int d [3];
  ulong local_58;
  int local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  if (2 < (uint)dir) {
    return false;
  }
  if (this->m_dim < 1) {
    bVar2 = false;
  }
  else {
    uVar11 = (ulong)(uint)dir;
    bVar2 = ON_IsKnotVectorPeriodic
                      (this->m_order[uVar11],this->m_cv_count[uVar11],this->m_knot[uVar11]);
    if (bVar2) {
      local_50 = 0;
      local_58 = 0;
      *(int *)((long)&local_58 + uVar11 * 4) =
           (this->m_cv_count[uVar11] - this->m_order[uVar11]) + 1;
      iVar1 = local_50;
      local_48 = local_58 & 0xffffffff;
      bVar3 = this->m_cv_count[0] <= (int)local_58;
      if ((int)local_58 < this->m_cv_count[0]) {
        uVar11 = local_58 >> 0x20;
        iVar9 = 0;
        local_40 = uVar11;
        do {
          if ((int)uVar11 < this->m_cv_count[1]) {
            iVar8 = 0;
            local_38 = (long)((int)local_48 + iVar9);
            do {
              if (iVar1 < this->m_cv_count[2]) {
                iVar6 = (int)local_40;
                iVar7 = 0;
                do {
                  pdVar10 = this->m_cv;
                  if (pdVar10 == (double *)0x0) {
                    pointA = (double *)0x0;
                    pdVar10 = (double *)0x0;
                  }
                  else {
                    pointA = pdVar10 + (long)this->m_cv_stride[0] * (long)iVar9 +
                                       (long)this->m_cv_stride[1] * (long)iVar8 +
                                       (long)iVar7 * (long)this->m_cv_stride[2];
                    pdVar10 = pdVar10 + this->m_cv_stride[0] * local_38 +
                                        (long)this->m_cv_stride[1] * (long)(iVar6 + iVar8) +
                                        (long)(iVar7 + iVar1) * (long)this->m_cv_stride[2];
                  }
                  bVar4 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat,pointA,pdVar10);
                  if (!bVar4) {
                    return (bool)(bVar2 & bVar3);
                  }
                  iVar5 = iVar7 + iVar1;
                  iVar7 = iVar7 + 1;
                } while (iVar5 + 1 < this->m_cv_count[2]);
              }
              iVar6 = (int)local_40 + iVar8;
              iVar8 = iVar8 + 1;
              uVar11 = local_40;
            } while (iVar6 + 1 < this->m_cv_count[1]);
          }
          iVar8 = (int)local_48 + iVar9 + 1;
          iVar9 = iVar9 + 1;
          bVar3 = this->m_cv_count[0] <= iVar8;
        } while (iVar8 < this->m_cv_count[0]);
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_NurbsCage::IsPeriodic(int dir) const
{
  bool bIsPeriodic = false;
  if ( dir >= 0 && dir <= 2 && m_dim > 0 )
  {
    bIsPeriodic = ON_IsKnotVectorPeriodic( m_order[dir], m_cv_count[dir], m_knot[dir] );
    if ( bIsPeriodic ) 
    {
      const double *cv0, *cv1;
      int i,j,k,d[3] = {0,0,0};
      d[dir] = m_cv_count[dir] - (m_order[dir]-1);
      for ( i = 0; i+d[0] < m_cv_count[0]; i++ )
      {
        for ( j = 0; j+d[1] < m_cv_count[1]; j++ )
        {
          for ( k = 0; k+d[2] < m_cv_count[2]; k++ )
          {
            cv0 = CV(i,j,k);
            cv1 = CV(i+d[0],j+d[1],k+d[2]);
            if ( false == ON_PointsAreCoincident(m_dim, m_is_rat, cv0, cv1 ) )
              return false;
          }
        }
      }
    }
  }
  return bIsPeriodic;
}